

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::TestEventRepeater::OnTestIterationEnd
          (TestEventRepeater *this,UnitTest *unit_test,int iteration)

{
  TestEventListener *pTVar1;
  long lVar2;
  
  if ((this->forwarding_enabled_ == true) &&
     (lVar2 = (long)(this->listeners_).
                    super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->listeners_).
                    super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                    ._M_impl.super__Vector_impl_data._M_start, lVar2 != 0)) {
    lVar2 = lVar2 >> 3;
    do {
      pTVar1 = (this->listeners_).
               super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar2 + -1];
      (*pTVar1->_vptr_TestEventListener[0xf])(pTVar1,unit_test,(ulong)(uint)iteration);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void TestEventRepeater::OnTestIterationEnd(const UnitTest& unit_test,
                                           int iteration) {
  if (forwarding_enabled_) {
    for (size_t i = listeners_.size(); i > 0; i--) {
      listeners_[i - 1]->OnTestIterationEnd(unit_test, iteration);
    }
  }
}